

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.cpp
# Opt level: O2

int __thiscall
Centaurus::Grammar<char>::verify
          (Grammar<char> *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  bool bVar1;
  wostream *pwVar2;
  undefined7 extraout_var;
  __node_base *p_Var3;
  CompositeATN<char> local_60;
  
  p_Var3 = &(this->m_networks)._M_h._M_before_begin;
  do {
    p_Var3 = p_Var3->_M_nxt;
    if (p_Var3 == (__node_base *)0x0) {
      CompositeATN<char>::CompositeATN(&local_60,this);
      bVar1 = CompositeATN<char>::verify_decisions(&local_60,&this->m_networks);
      CompositeATN<char>::~CompositeATN(&local_60);
      return (int)CONCAT71(extraout_var,bVar1);
    }
    bVar1 = ATNMachine<char>::verify_invocations((ATNMachine<char> *)(p_Var3 + 6),&this->m_networks)
    ;
  } while (bVar1);
  pwVar2 = std::operator<<((wostream *)&std::wcerr,L"Nonterminal invocation check failed at ");
  pwVar2 = std::operator<<(pwVar2,(wstring *)(p_Var3 + 2));
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
  return 0;
}

Assistant:

bool Grammar<TCHAR>::verify() const
{
    for (const auto& p : m_networks)
    {
        if (!p.second.verify_invocations(m_networks))
        {
            std::wcerr << L"Nonterminal invocation check failed at " << p.first << std::endl;
            return false;
        }
    }

    if (!CompositeATN<TCHAR>(*this).verify_decisions(m_networks))
    {
        return false;
    }

    return true;
}